

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search_fwdflat.c
# Opt level: O2

void ngram_fwdflat_finish(ngram_search_t *ngs)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  chan_t *elem;
  chan_s *pcVar5;
  ps_latnode_s *ppVar6;
  ps_latnode_t *elem_00;
  long lVar7;
  long lVar8;
  
  lVar7 = 0;
  while( true ) {
    iVar2 = *(int *)((long)ngs->fwdflat_wordlist + lVar7);
    lVar8 = (long)iVar2;
    if (lVar8 < 0) break;
    if (((ngs->base).dict)->word[lVar8].pronlen != 1) {
      elem = ngs->word_chan[lVar8];
      if (elem == (chan_t *)0x0) {
        __assert_fail("ngs->word_chan[wid] != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
                      ,0x38e,"void destroy_fwdflat_chan(ngram_search_t *)");
      }
      pcVar5 = elem->next;
      __listelem_free__(ngs->root_chan_alloc,elem,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
                        ,0x397);
      ngs->word_chan[lVar8] = pcVar5;
      ngram_search_free_all_rc(ngs,iVar2);
    }
    lVar7 = lVar7 + 4;
  }
  if (ngs->fwdtree != '\0') {
    for (lVar7 = 0; lVar7 < ngs->n_frame; lVar7 = lVar7 + 1) {
      elem_00 = ngs->frm_wordlist[lVar7];
      while (elem_00 != (ps_latnode_t *)0x0) {
        ppVar6 = elem_00->next;
        __listelem_free__(ngs->latnode_alloc,elem_00,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
                          ,0x37b);
        elem_00 = ppVar6;
      }
    }
  }
  memset(ngs->word_active,0,(long)(((ngs->base).n_words + 0x1f) / 0x20) << 2);
  uVar3 = ((ngs->base).acmod)->output_frame;
  ngram_search_mark_bptable(ngs,uVar3);
  ptmr_stop(&ngs->fwdflat_perf);
  if (0 < (int)uVar3) {
    iVar2 = uVar3 + 1;
    lVar7 = ps_config_int((ngs->base).config,"frate");
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
            ,0x3b1,"%8d words recognized (%d/fr)\n",(ulong)(uint)ngs->bpidx,
            (long)(int)(ngs->bpidx + (uVar3 >> 1)) / (long)iVar2 & 0xffffffff);
    uVar4 = (ngs->st).n_senone_active_utt;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
            ,0x3b3,"%8d senones evaluated (%d/fr)\n",(ulong)uVar4,
            (long)(int)((uVar3 >> 1) + uVar4) / (long)iVar2 & 0xffffffff);
    uVar3 = (ngs->st).n_fwdflat_chan;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
            ,0x3b5,"%8d channels searched (%d/fr)\n",(ulong)uVar3,
            (long)(int)uVar3 / (long)iVar2 & 0xffffffff);
    uVar3 = (ngs->st).n_fwdflat_words;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
            ,0x3b7,"%8d words searched (%d/fr)\n",(ulong)uVar3,
            (long)(int)uVar3 / (long)iVar2 & 0xffffffff);
    uVar3 = (ngs->st).n_fwdflat_word_transition;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
            ,0x3ba,"%8d word transitions (%d/fr)\n",(ulong)uVar3,
            (long)(int)uVar3 / (long)iVar2 & 0xffffffff);
    dVar1 = (double)(ngs->fwdflat_perf).t_cpu;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
            ,0x3bd,"fwdflat %.2f CPU %.3f xRT\n",dVar1,dVar1 / ((double)iVar2 / (double)lVar7));
    dVar1 = (double)(ngs->fwdflat_perf).t_elapsed;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
            ,0x3c0,"fwdflat %.2f wall %.3f xRT\n",dVar1,dVar1 / ((double)iVar2 / (double)lVar7));
    return;
  }
  return;
}

Assistant:

void
ngram_fwdflat_finish(ngram_search_t *ngs)
{
    int32 cf;

    destroy_fwdflat_chan(ngs);
    destroy_fwdflat_wordlist(ngs);
    bitvec_clear_all(ngs->word_active, ps_search_n_words(ngs));

    /* This is the number of frames processed. */
    cf = ps_search_acmod(ngs)->output_frame;
    /* Add a mark in the backpointer table for one past the final frame. */
    ngram_search_mark_bptable(ngs, cf);

    ptmr_stop(&ngs->fwdflat_perf);
    /* Print out some statistics. */
    if (cf > 0) {
        double n_speech = (double)(cf + 1)
            / ps_config_int(ps_search_config(ngs), "frate");
        E_INFO("%8d words recognized (%d/fr)\n",
               ngs->bpidx, (ngs->bpidx + (cf >> 1)) / (cf + 1));
        E_INFO("%8d senones evaluated (%d/fr)\n", ngs->st.n_senone_active_utt,
               (ngs->st.n_senone_active_utt + (cf >> 1)) / (cf + 1));
        E_INFO("%8d channels searched (%d/fr)\n",
               ngs->st.n_fwdflat_chan, ngs->st.n_fwdflat_chan / (cf + 1));
        E_INFO("%8d words searched (%d/fr)\n",
               ngs->st.n_fwdflat_words, ngs->st.n_fwdflat_words / (cf + 1));
        E_INFO("%8d word transitions (%d/fr)\n",
               ngs->st.n_fwdflat_word_transition,
               ngs->st.n_fwdflat_word_transition / (cf + 1));
        E_INFO("fwdflat %.2f CPU %.3f xRT\n",
               ngs->fwdflat_perf.t_cpu,
               ngs->fwdflat_perf.t_cpu / n_speech);
        E_INFO("fwdflat %.2f wall %.3f xRT\n",
               ngs->fwdflat_perf.t_elapsed,
               ngs->fwdflat_perf.t_elapsed / n_speech);
    }
}